

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

void FlatZinc::anon_unknown_4::p_int_CMP_reif(IntRelType irt,ConExpr *ce,Node *ann)

{
  pointer ppNVar1;
  long lVar2;
  IntVar *x;
  IntVar *y;
  undefined8 *puVar3;
  int c;
  Node *pNVar4;
  BoolView *r;
  undefined1 auVar5 [16];
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  ppNVar1 = (ce->args->a).
            super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  auVar5 = __dynamic_cast(ppNVar1[2],&AST::Node::typeinfo,&AST::BoolLit::typeinfo,0);
  if (auVar5._0_8_ != 0) {
    if (*(char *)(auVar5._0_8_ + 8) != '\x01') {
      if (IRT_GT < irt) {
        _GLOBAL__N_1::p_int_CMP_reif();
        goto LAB_00134c2e;
      }
      irt = *(IntRelType *)(&DAT_001d9cf0 + (ulong)irt * 4);
    }
    p_int_CMP(irt,ce,auVar5._8_8_);
    return;
  }
  pNVar4 = *ppNVar1;
  lVar2 = __dynamic_cast(pNVar4,&AST::Node::typeinfo,&AST::IntVar::typeinfo,0);
  if (lVar2 == 0) {
    x = getIntVar(ppNVar1[1]);
    if (irt - IRT_LE < 4) {
      irt = *(IntRelType *)(&DAT_001d94b0 + (ulong)(irt - IRT_LE) * 4);
    }
    ppNVar1 = (ce->args->a).
              super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar2 = __dynamic_cast(*ppNVar1,&AST::Node::typeinfo,&AST::IntLit::typeinfo,0);
    if (lVar2 == 0) goto LAB_00134c2e;
    c = *(int *)(lVar2 + 8);
    pNVar4 = ppNVar1[2];
    r = &local_60;
  }
  else {
    lVar2 = __dynamic_cast(ppNVar1[1],&AST::Node::typeinfo,&AST::IntVar::typeinfo,0);
    x = getIntVar(pNVar4);
    ppNVar1 = (ce->args->a).
              super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar4 = ppNVar1[1];
    if (lVar2 != 0) {
      y = getIntVar(pNVar4);
      getBoolVar((anon_unknown_4 *)&local_40,
                 (ce->args->a).
                 super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[2]);
      int_rel_reif(x,irt,y,&local_40,0);
      return;
    }
    lVar2 = __dynamic_cast(pNVar4,&AST::Node::typeinfo,&AST::IntLit::typeinfo,0);
    if (lVar2 == 0) {
LAB_00134c2e:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "integer literal expected";
      __cxa_throw(puVar3,&AST::TypeError::typeinfo,0);
    }
    c = *(int *)(lVar2 + 8);
    pNVar4 = ppNVar1[2];
    r = &local_50;
  }
  getBoolVar((anon_unknown_4 *)r,pNVar4);
  int_rel_reif(x,irt,c,r);
  return;
}

Assistant:

void p_int_CMP_reif(IntRelType irt, const ConExpr& ce, AST::Node* ann) {
	if (ce[2]->isBool()) {
		if (ce[2]->getBool()) {
			p_int_CMP(irt, ce, ann);
		} else {
			p_int_CMP(!irt, ce, ann);
		}
		return;
	}
	if (ce[0]->isIntVar()) {
		if (ce[1]->isIntVar()) {
			int_rel_reif(getIntVar(ce[0]), irt, getIntVar(ce[1]), getBoolVar(ce[2]));
		} else {
			int_rel_reif(getIntVar(ce[0]), irt, ce[1]->getInt(), getBoolVar(ce[2]));
		}
	} else {
		int_rel_reif(getIntVar(ce[1]), -irt, ce[0]->getInt(), getBoolVar(ce[2]));
	}
}